

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall helics::CommonCore::isLocal(CommonCore *this,GlobalFederateId global_fedid)

{
  bool bVar1;
  undefined4 in_ESI;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *unaff_retaddr;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffc0;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_28;
  undefined4 in_stack_fffffffffffffff8;
  
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (unaff_retaddr,(GlobalFederateId *)CONCAT44(in_ESI,in_stack_fffffffffffffff8));
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::end
            (in_stack_ffffffffffffffc0);
  bVar1 = gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
          ::operator!=(&local_28,
                       (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                       &stack0xffffffffffffffc0);
  return bVar1;
}

Assistant:

bool CommonCore::isLocal(GlobalFederateId global_fedid) const
{
    return (loopFederates.find(global_fedid) != loopFederates.end());
}